

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_striped_avx2_256_32.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_trace_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  longlong lVar5;
  __m256i alVar6;
  __m256i vH_00;
  __m256i alVar7;
  __m256i vH_01;
  __m256i vH_02;
  __m256i vH_03;
  __m256i vH_04;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [24];
  __m256i *palVar32;
  __m256i *palVar33;
  uint uVar34;
  int iVar35;
  long lVar36;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined8 uVar37;
  int in_R9D;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  int in_stack_00000008;
  __m256i vH_1;
  int32_t temp;
  int32_t column_len;
  int32_t *t;
  __m256i vCompare;
  __m256i vT_5;
  __m256i cond_4;
  __m256i vEa_ext_1;
  __m256i vEa_1;
  __m256i vT_4;
  __m256i cond_3;
  __m256i vTAll_3;
  __m256i cond_2;
  __m256i case2_1;
  __m256i case1_1;
  __m256i vT_3;
  __m256i vTAll_2;
  __m256i vHp;
  int32_t tmp2;
  int64_t tmp_4;
  __m256i vT_2;
  __m256i cond_1;
  __m256i vTAll_1;
  __m256i vT_1;
  __m256i cond;
  __m256i vEa_ext;
  __m256i vEa;
  __m256i vT;
  __m256i case2;
  __m256i case1;
  __m256i vTAll;
  __m256i *tmp_3;
  __m256i *tmp_2;
  __m256i *vP;
  __m256i vH_dag;
  __m256i vH;
  __m256i vFa_ext;
  __m256i vFa;
  __m256i vF_ext;
  __m256i vF;
  __m256i vE_ext;
  __m256i vE;
  __m256i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_32_t e;
  __m256i_32_t h;
  int32_t segNum;
  int32_t index;
  __m256i vFTMask;
  __m256i vTMask;
  __m256i vTDelF;
  __m256i vTDiagF;
  __m256i vTInsE;
  __m256i vTDiagE;
  __m256i vTDiag;
  __m256i vTDel;
  __m256i vTIns;
  parasail_result_t *result;
  __m256i vPosMask;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  int32_t *boundary;
  __m256i *pvHT;
  __m256i *pvEaLoad;
  __m256i *pvEaStore;
  __m256i *pvE;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int32_t in_stack_ffffffffffffe0ec;
  long in_stack_ffffffffffffe0f0;
  undefined4 in_stack_ffffffffffffe0f8;
  int in_stack_ffffffffffffe0fc;
  long in_stack_ffffffffffffe100;
  undefined4 in_stack_ffffffffffffe108;
  int in_stack_ffffffffffffe10c;
  long in_stack_ffffffffffffe110;
  int local_1ee8;
  int local_1ee0;
  undefined4 uVar41;
  undefined4 uVar42;
  int local_1eac;
  undefined1 local_1ea0 [56];
  __m256i *local_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  long lStack_1e48;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  longlong local_1de0;
  longlong lStack_1dd8;
  longlong lStack_1dd0;
  longlong lStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined1 local_1d80 [16];
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  longlong local_1d00;
  longlong lStack_1cf8;
  longlong lStack_1cf0;
  longlong lStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  __m256i local_1cc0;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  longlong local_1bc0;
  longlong lStack_1bb8;
  longlong lStack_1bb0;
  longlong lStack_1ba8;
  longlong local_1ba0;
  longlong lStack_1b98;
  longlong lStack_1b90;
  longlong lStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  __m256i local_1ae0;
  undefined1 local_1ac0 [32];
  undefined1 local_1aa0 [32];
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [32];
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  longlong local_1a20;
  longlong lStack_1a18;
  longlong lStack_1a10;
  longlong lStack_1a08;
  undefined1 local_1a00 [32];
  longlong local_19c0;
  longlong lStack_19b8;
  longlong lStack_19b0;
  longlong lStack_19a8;
  longlong local_19a0;
  longlong lStack_1998;
  longlong lStack_1990;
  longlong lStack_1988;
  int local_1968;
  int local_1964;
  undefined1 local_1960 [16];
  undefined1 auStack_1950 [16];
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  parasail_result_t *local_1828;
  undefined1 local_1820 [32];
  undefined1 local_1800 [32];
  undefined1 local_17e0 [32];
  undefined1 local_17c0 [32];
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  uint local_174c;
  uint local_1748;
  uint local_1744;
  undefined1 local_1740 [16];
  undefined1 auStack_1730 [16];
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  int32_t *local_16f0;
  __m256i *local_16e8;
  __m256i *local_16e0;
  __m256i *local_16d8;
  __m256i *local_16d0;
  __m256i *local_16c8;
  __m256i *local_16c0;
  long local_16b8;
  uint local_16b0;
  int local_16ac;
  int local_16a8;
  int local_16a4;
  long local_16a0;
  int local_1698;
  int local_1694;
  int local_1690;
  int local_168c;
  int local_1688;
  uint local_1684;
  int local_1680;
  uint local_167c;
  uint local_1678;
  int local_1674;
  long local_1670;
  parasail_result_t *local_1660;
  undefined4 local_1658;
  undefined4 local_1654;
  undefined4 local_1650;
  undefined4 local_164c;
  undefined4 local_1648;
  undefined4 local_1644;
  undefined4 local_1640;
  undefined4 local_163c;
  undefined4 local_1638;
  uint local_1634;
  uint local_1630;
  uint local_162c;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  longlong local_15c0;
  longlong lStack_15b8;
  longlong lStack_15b0;
  longlong lStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  longlong local_1580;
  longlong lStack_1578;
  longlong lStack_1570;
  longlong lStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  longlong local_1540;
  longlong lStack_1538;
  longlong lStack_1530;
  longlong lStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  longlong local_1500;
  longlong lStack_14f8;
  longlong lStack_14f0;
  longlong lStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined1 local_14a0 [16];
  undefined1 auStack_1490 [16];
  undefined1 local_1460 [32];
  undefined1 local_1420 [16];
  undefined1 auStack_1410 [16];
  uint local_1400;
  uint local_13fc;
  uint local_13f8;
  uint local_13f4;
  uint local_13f0;
  uint local_13ec;
  uint local_13e8;
  uint local_13e4;
  undefined1 local_13e0 [16];
  undefined1 auStack_13d0 [16];
  uint local_13c0;
  uint local_13bc;
  uint local_13b8;
  uint local_13b4;
  uint local_13b0;
  uint local_13ac;
  uint local_13a8;
  uint local_13a4;
  undefined1 local_13a0 [16];
  undefined1 auStack_1390 [16];
  uint local_1380;
  uint local_137c;
  uint local_1378;
  uint local_1374;
  uint local_1370;
  uint local_136c;
  uint local_1368;
  uint local_1364;
  undefined1 local_1360 [16];
  undefined1 auStack_1350 [16];
  undefined4 local_1340;
  undefined4 local_133c;
  undefined4 local_1338;
  undefined4 local_1334;
  undefined4 local_1330;
  undefined4 local_132c;
  undefined4 local_1328;
  undefined4 local_1324;
  undefined1 local_1320 [16];
  undefined1 auStack_1310 [16];
  undefined4 local_1300;
  undefined4 local_12fc;
  undefined4 local_12f8;
  undefined4 local_12f4;
  undefined4 local_12f0;
  undefined4 local_12ec;
  undefined4 local_12e8;
  undefined4 local_12e4;
  undefined1 local_12e0 [16];
  undefined1 auStack_12d0 [16];
  undefined4 local_12c0;
  undefined4 local_12bc;
  undefined4 local_12b8;
  undefined4 local_12b4;
  undefined4 local_12b0;
  undefined4 local_12ac;
  undefined4 local_12a8;
  undefined4 local_12a4;
  undefined1 local_12a0 [16];
  undefined1 auStack_1290 [16];
  undefined4 local_1280;
  undefined4 local_127c;
  undefined4 local_1278;
  undefined4 local_1274;
  undefined4 local_1270;
  undefined4 local_126c;
  undefined4 local_1268;
  undefined4 local_1264;
  undefined1 local_1260 [16];
  undefined1 auStack_1250 [16];
  undefined4 local_1240;
  undefined4 local_123c;
  undefined4 local_1238;
  undefined4 local_1234;
  undefined4 local_1230;
  undefined4 local_122c;
  undefined4 local_1228;
  undefined4 local_1224;
  undefined1 local_1220 [16];
  undefined1 auStack_1210 [16];
  undefined4 local_1200;
  undefined4 local_11fc;
  undefined4 local_11f8;
  undefined4 local_11f4;
  undefined4 local_11f0;
  undefined4 local_11ec;
  undefined4 local_11e8;
  undefined4 local_11e4;
  undefined1 local_11e0 [16];
  undefined1 auStack_11d0 [16];
  undefined4 local_11c0;
  undefined4 local_11bc;
  undefined4 local_11b8;
  undefined4 local_11b4;
  undefined4 local_11b0;
  undefined4 local_11ac;
  undefined4 local_11a8;
  undefined4 local_11a4;
  undefined1 local_11a0 [16];
  undefined1 auStack_1190 [16];
  undefined4 local_1180;
  undefined4 local_117c;
  undefined4 local_1178;
  undefined4 local_1174;
  undefined4 local_1170;
  undefined4 local_116c;
  undefined4 local_1168;
  undefined4 local_1164;
  undefined1 local_1160 [32];
  undefined4 local_1140;
  undefined4 local_113c;
  undefined4 local_1138;
  undefined4 local_1134;
  undefined4 local_1130;
  undefined4 local_112c;
  undefined4 local_1128;
  undefined4 local_1124;
  undefined1 local_1120 [16];
  undefined1 auStack_1110 [16];
  undefined4 local_1100;
  undefined4 local_10fc;
  undefined4 local_10f8;
  undefined4 local_10f4;
  undefined4 local_10f0;
  undefined4 local_10ec;
  undefined4 local_10e8;
  undefined4 local_10e4;
  longlong local_10e0;
  longlong lStack_10d8;
  longlong lStack_10d0;
  longlong lStack_10c8;
  __m256i *local_10a8;
  longlong local_10a0;
  longlong lStack_1098;
  longlong lStack_1090;
  longlong lStack_1088;
  __m256i *local_1068;
  longlong local_1060;
  longlong lStack_1058;
  longlong lStack_1050;
  longlong lStack_1048;
  __m256i *local_1028;
  longlong local_1020;
  longlong lStack_1018;
  longlong lStack_1010;
  longlong lStack_1008;
  __m256i *local_fe8;
  longlong local_fe0;
  longlong lStack_fd8;
  longlong lStack_fd0;
  longlong lStack_fc8;
  __m256i *local_fa8;
  longlong local_fa0;
  longlong lStack_f98;
  longlong lStack_f90;
  longlong lStack_f88;
  __m256i *local_f68;
  longlong local_f60;
  longlong lStack_f58;
  longlong lStack_f50;
  longlong lStack_f48;
  __m256i *local_f28;
  __m256i *local_ee8;
  __m256i *local_ea8;
  __m256i *local_e70;
  __m256i *local_e68;
  __m256i *local_e60;
  __m256i *local_e58;
  __m256i *local_e50;
  __m256i *local_e48;
  undefined1 (*local_e40) [32];
  __m256i *local_e38;
  __m256i *local_e30;
  __m256i *local_e28;
  __m256i *local_e20;
  undefined1 (*local_e18) [32];
  __m256i *local_e10;
  __m256i *local_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  longlong local_de0;
  longlong lStack_dd8;
  longlong lStack_dd0;
  longlong lStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  longlong local_da0;
  longlong lStack_d98;
  longlong lStack_d90;
  longlong lStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  longlong lStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  longlong local_cc0;
  longlong lStack_cb8;
  longlong lStack_cb0;
  longlong lStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  longlong lStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  longlong local_b80;
  longlong lStack_b78;
  longlong lStack_b70;
  longlong lStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  longlong lStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  longlong local_ac0;
  longlong lStack_ab8;
  longlong lStack_ab0;
  longlong lStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  longlong lStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  longlong local_a00;
  longlong lStack_9f8;
  longlong lStack_9f0;
  longlong lStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  longlong lStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [32];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  longlong local_660;
  longlong lStack_658;
  longlong lStack_650;
  longlong lStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  longlong local_5c0;
  longlong lStack_5b8;
  longlong lStack_5b0;
  longlong lStack_5a8;
  undefined1 local_5a0 [16];
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  longlong lStack_528;
  undefined1 local_520 [16];
  undefined1 auStack_510 [16];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  longlong local_4c0;
  longlong lStack_4b8;
  longlong lStack_4b0;
  longlong lStack_4a8;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [16];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [16];
  undefined1 auStack_450 [16];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  longlong lStack_428;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  longlong lStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  longlong local_3c0;
  longlong lStack_3b8;
  longlong lStack_3b0;
  longlong lStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  longlong lStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [32];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  long lStack_68;
  undefined1 local_60 [32];
  
  local_1684 = 0;
  local_1688 = 0;
  local_168c = 0;
  local_1690 = 0;
  local_1694 = 0;
  local_1698 = 0;
  local_16a0 = 0;
  local_16a4 = 0;
  local_16a8 = 0;
  local_16ac = 0;
  local_16b0 = 0;
  local_16b8 = 0;
  local_16c0 = (__m256i *)0x0;
  local_16c8 = (__m256i *)0x0;
  local_16d0 = (__m256i *)0x0;
  local_16d8 = (__m256i *)0x0;
  local_16e0 = (__m256i *)0x0;
  local_16e8 = (__m256i *)0x0;
  local_16f0 = (int32_t *)0x0;
  local_1744 = 0;
  local_1748 = 0;
  local_174c = 0;
  local_1828 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_trace_striped_profile_avx2_256_32",
            "profile");
    local_1660 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x48) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_trace_striped_profile_avx2_256_32",
            "profile->profile32.score");
    local_1660 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_trace_striped_profile_avx2_256_32",
            "profile->matrix");
    local_1660 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_trace_striped_profile_avx2_256_32",
            "profile->s1Len");
    local_1660 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_trace_striped_profile_avx2_256_32","s2");
    local_1660 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_trace_striped_profile_avx2_256_32",
            "s2Len");
    local_1660 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_trace_striped_profile_avx2_256_32",
            "open");
    local_1660 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_trace_striped_profile_avx2_256_32",
            "gap");
    local_1660 = (parasail_result_t *)0x0;
  }
  else {
    local_1684 = 0;
    local_1688 = 0;
    local_168c = 0;
    local_1690 = *(int *)(in_RDI + 8);
    local_1694 = local_1690 + -1;
    local_1698 = in_EDX + -1;
    local_16a0 = *(long *)(in_RDI + 0x10);
    local_16a4 = 8;
    local_16a8 = (local_1690 + 7) / 8;
    local_16ac = (local_1690 + -1) % local_16a8;
    local_16b0 = ~((local_1690 + -1) / local_16a8) + 8;
    local_16b8 = *(long *)(in_RDI + 0x48);
    auVar1 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar1 = vpinsrd_avx(auVar1,in_ECX,2);
    local_14a0 = vpinsrd_avx(auVar1,in_ECX,3);
    auVar1 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar1 = vpinsrd_avx(auVar1,in_ECX,2);
    auStack_1490 = vpinsrd_avx(auVar1,in_ECX,3);
    local_1720 = local_14a0._0_8_;
    uStack_1718 = local_14a0._8_8_;
    uStack_1710 = auStack_1490._0_8_;
    uStack_1708 = auStack_1490._8_8_;
    auVar1 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar1 = vpinsrd_avx(auVar1,in_R8D,2);
    auVar1 = vpinsrd_avx(auVar1,in_R8D,3);
    auVar2 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar2 = vpinsrd_avx(auVar2,in_R8D,2);
    auVar2 = vpinsrd_avx(auVar2,in_R8D,3);
    local_1460._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    local_1460._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    if ((int)-in_ECX < *(int *)(local_16a0 + 0x20)) {
      local_1eac = in_ECX + 0x80000000;
    }
    else {
      local_1eac = -0x80000000 - *(int *)(local_16a0 + 0x20);
    }
    local_174c = local_1eac + 1;
    local_1748 = 0x7ffffffe - *(int *)(local_16a0 + 0x1c);
    auVar1 = vpinsrd_avx(ZEXT416(local_174c),local_174c,1);
    auVar1 = vpinsrd_avx(auVar1,local_174c,2);
    local_1420 = vpinsrd_avx(auVar1,local_174c,3);
    auVar1 = vpinsrd_avx(ZEXT416(local_174c),local_174c,1);
    auVar1 = vpinsrd_avx(auVar1,local_174c,2);
    auStack_1410 = vpinsrd_avx(auVar1,local_174c,3);
    local_1780 = local_1420._0_8_;
    uStack_1778 = local_1420._8_8_;
    uStack_1770 = auStack_1410._0_8_;
    uStack_1768 = auStack_1410._8_8_;
    auVar1 = vpinsrd_avx(ZEXT416(local_1748),local_1748,1);
    auVar1 = vpinsrd_avx(auVar1,local_1748,2);
    local_13e0 = vpinsrd_avx(auVar1,local_1748,3);
    auVar1 = vpinsrd_avx(ZEXT416(local_1748),local_1748,1);
    auVar1 = vpinsrd_avx(auVar1,local_1748,2);
    auStack_13d0 = vpinsrd_avx(auVar1,local_1748,3);
    local_17a0 = local_13e0._0_8_;
    uStack_1798 = local_13e0._8_8_;
    uStack_1790 = auStack_13d0._0_8_;
    uStack_1788 = auStack_13d0._8_8_;
    local_17c0._16_8_ = auStack_13d0._0_8_;
    local_17c0._0_16_ = local_13e0;
    local_17c0._24_8_ = auStack_13d0._8_8_;
    local_17e0._16_8_ = auStack_1410._0_8_;
    local_17e0._0_16_ = local_1420;
    local_17e0._24_8_ = auStack_1410._8_8_;
    local_1800._16_8_ = auStack_1410._0_8_;
    local_1800._0_16_ = local_1420;
    local_1800._24_8_ = auStack_1410._8_8_;
    auVar1 = vpinsrd_avx(ZEXT416(local_16b0),local_16b0,1);
    auVar1 = vpinsrd_avx(auVar1,local_16b0,2);
    local_13a0 = vpinsrd_avx(auVar1,local_16b0,3);
    auVar1 = vpinsrd_avx(ZEXT416(local_16b0),local_16b0,1);
    auVar1 = vpinsrd_avx(auVar1,local_16b0,2);
    auStack_1390 = vpinsrd_avx(auVar1,local_16b0,3);
    local_10e4 = 0;
    local_10e8 = 1;
    local_10ec = 2;
    local_10f0 = 3;
    local_10f4 = 4;
    local_10f8 = 5;
    local_10fc = 6;
    local_1100 = 7;
    auVar1 = vpinsrd_avx(ZEXT416(7),6,1);
    auVar1 = vpinsrd_avx(auVar1,5,2);
    local_1120 = vpinsrd_avx(auVar1,4,3);
    auVar1 = vpinsrd_avx(ZEXT416(3),2,1);
    auVar1 = vpinsrd_avx(auVar1,1,2);
    auStack_1110 = vpinsrd_avx(auVar1,0,3);
    local_14c0 = local_13a0._0_8_;
    uStack_14b8 = local_13a0._8_8_;
    uStack_14b0 = auStack_1390._0_8_;
    uStack_14a8 = auStack_1390._8_8_;
    local_14e0 = local_1120._0_8_;
    uStack_14d8 = local_1120._8_8_;
    uStack_14d0 = auStack_1110._0_8_;
    uStack_14c8 = auStack_1110._8_8_;
    auVar39._16_8_ = auStack_1390._0_8_;
    auVar39._0_16_ = local_13a0;
    auVar39._24_8_ = auStack_1390._8_8_;
    auVar4._16_8_ = auStack_1110._0_8_;
    auVar4._0_16_ = local_1120;
    auVar4._24_8_ = auStack_1110._8_8_;
    local_1820 = vpcmpeqd_avx2(auVar39,auVar4);
    local_1638 = 1;
    uVar41 = 1;
    local_1324 = 1;
    local_1328 = 1;
    local_132c = 1;
    local_1330 = 1;
    local_1334 = 1;
    local_1338 = 1;
    local_133c = 1;
    local_1340 = 1;
    auVar1 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar1 = vpinsrd_avx(auVar1,1,2);
    local_1360 = vpinsrd_avx(auVar1,1,3);
    auVar1 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar1 = vpinsrd_avx(auVar1,1,2);
    auStack_1350 = vpinsrd_avx(auVar1,1,3);
    local_1860 = local_1360._0_8_;
    uStack_1858 = local_1360._8_8_;
    uStack_1850 = auStack_1350._0_8_;
    uStack_1848 = auStack_1350._8_8_;
    local_163c = 2;
    uVar42 = 2;
    local_12e4 = 2;
    local_12e8 = 2;
    local_12ec = 2;
    local_12f0 = 2;
    local_12f4 = 2;
    local_12f8 = 2;
    local_12fc = 2;
    local_1300 = 2;
    auVar1 = vpinsrd_avx(ZEXT416(2),2,1);
    auVar1 = vpinsrd_avx(auVar1,2,2);
    local_1320 = vpinsrd_avx(auVar1,2,3);
    auVar1 = vpinsrd_avx(ZEXT416(2),2,1);
    auVar1 = vpinsrd_avx(auVar1,2,2);
    auStack_1310 = vpinsrd_avx(auVar1,2,3);
    local_1880 = local_1320._0_8_;
    uStack_1878 = local_1320._8_8_;
    uStack_1870 = auStack_1310._0_8_;
    uStack_1868 = auStack_1310._8_8_;
    local_1640 = 4;
    local_12a4 = 4;
    local_12a8 = 4;
    local_12ac = 4;
    local_12b0 = 4;
    local_12b4 = 4;
    local_12b8 = 4;
    local_12bc = 4;
    local_12c0 = 4;
    auVar1 = vpinsrd_avx(ZEXT416(4),4,1);
    auVar1 = vpinsrd_avx(auVar1,4,2);
    local_12e0 = vpinsrd_avx(auVar1,4,3);
    auVar1 = vpinsrd_avx(ZEXT416(4),4,1);
    auVar1 = vpinsrd_avx(auVar1,4,2);
    auStack_12d0 = vpinsrd_avx(auVar1,4,3);
    local_18a0 = local_12e0._0_8_;
    uStack_1898 = local_12e0._8_8_;
    uStack_1890 = auStack_12d0._0_8_;
    uStack_1888 = auStack_12d0._8_8_;
    local_1644 = 8;
    local_1264 = 8;
    local_1268 = 8;
    local_126c = 8;
    local_1270 = 8;
    local_1274 = 8;
    local_1278 = 8;
    local_127c = 8;
    local_1280 = 8;
    auVar1 = vpinsrd_avx(ZEXT416(8),8,1);
    auVar1 = vpinsrd_avx(auVar1,8,2);
    local_12a0 = vpinsrd_avx(auVar1,8,3);
    auVar1 = vpinsrd_avx(ZEXT416(8),8,1);
    auVar1 = vpinsrd_avx(auVar1,8,2);
    auStack_1290 = vpinsrd_avx(auVar1,8,3);
    local_18c0 = local_12a0._0_8_;
    uStack_18b8 = local_12a0._8_8_;
    uStack_18b0 = auStack_1290._0_8_;
    uStack_18a8 = auStack_1290._8_8_;
    local_1648 = 0x10;
    local_1224 = 0x10;
    local_1228 = 0x10;
    local_122c = 0x10;
    local_1230 = 0x10;
    local_1234 = 0x10;
    local_1238 = 0x10;
    local_123c = 0x10;
    local_1240 = 0x10;
    auVar1 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar1 = vpinsrd_avx(auVar1,0x10,2);
    local_1260 = vpinsrd_avx(auVar1,0x10,3);
    auVar1 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar1 = vpinsrd_avx(auVar1,0x10,2);
    auStack_1250 = vpinsrd_avx(auVar1,0x10,3);
    local_18e0 = local_1260._0_8_;
    uStack_18d8 = local_1260._8_8_;
    uStack_18d0 = auStack_1250._0_8_;
    uStack_18c8 = auStack_1250._8_8_;
    local_164c = 0x20;
    local_11e4 = 0x20;
    local_11e8 = 0x20;
    local_11ec = 0x20;
    local_11f0 = 0x20;
    local_11f4 = 0x20;
    local_11f8 = 0x20;
    local_11fc = 0x20;
    local_1200 = 0x20;
    auVar1 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
    auVar1 = vpinsrd_avx(auVar1,0x20,2);
    local_1220 = vpinsrd_avx(auVar1,0x20,3);
    auVar1 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
    auVar1 = vpinsrd_avx(auVar1,0x20,2);
    auStack_1210 = vpinsrd_avx(auVar1,0x20,3);
    local_1900 = local_1220._0_8_;
    uStack_18f8 = local_1220._8_8_;
    uStack_18f0 = auStack_1210._0_8_;
    uStack_18e8 = auStack_1210._8_8_;
    local_1650 = 0x40;
    local_11a4 = 0x40;
    local_11a8 = 0x40;
    local_11ac = 0x40;
    local_11b0 = 0x40;
    local_11b4 = 0x40;
    local_11b8 = 0x40;
    local_11bc = 0x40;
    local_11c0 = 0x40;
    auVar1 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
    auVar1 = vpinsrd_avx(auVar1,0x40,2);
    local_11e0 = vpinsrd_avx(auVar1,0x40,3);
    auVar1 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
    auVar1 = vpinsrd_avx(auVar1,0x40,2);
    auStack_11d0 = vpinsrd_avx(auVar1,0x40,3);
    local_1920 = local_11e0._0_8_;
    uStack_1918 = local_11e0._8_8_;
    uStack_1910 = auStack_11d0._0_8_;
    uStack_1908 = auStack_11d0._8_8_;
    local_1654 = 0x78;
    local_1164 = 0x78;
    local_1168 = 0x78;
    local_116c = 0x78;
    local_1170 = 0x78;
    local_1174 = 0x78;
    local_1178 = 0x78;
    local_117c = 0x78;
    local_1180 = 0x78;
    auVar1 = vpinsrd_avx(ZEXT416(0x78),0x78,1);
    auVar1 = vpinsrd_avx(auVar1,0x78,2);
    local_11a0 = vpinsrd_avx(auVar1,0x78,3);
    auVar1 = vpinsrd_avx(ZEXT416(0x78),0x78,1);
    auVar1 = vpinsrd_avx(auVar1,0x78,2);
    auStack_1190 = vpinsrd_avx(auVar1,0x78,3);
    local_1940 = local_11a0._0_8_;
    uStack_1938 = local_11a0._8_8_;
    uStack_1930 = auStack_1190._0_8_;
    uStack_1928 = auStack_1190._8_8_;
    local_1658 = 0x1f;
    local_1124 = 0x1f;
    local_1128 = 0x1f;
    local_112c = 0x1f;
    local_1130 = 0x1f;
    local_1134 = 0x1f;
    local_1138 = 0x1f;
    local_113c = 0x1f;
    local_1140 = 0x1f;
    uVar37 = 0x1f;
    auVar1 = vpinsrd_avx(ZEXT416(0x1f),0x1f,1);
    auVar1 = vpinsrd_avx(auVar1,0x1f,2);
    auVar1 = vpinsrd_avx(auVar1,0x1f,3);
    auVar2 = vpinsrd_avx(ZEXT416(0x1f),0x1f,1);
    auVar2 = vpinsrd_avx(auVar2,0x1f,2);
    auVar2 = vpinsrd_avx(auVar2,0x1f,3);
    local_1160._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    local_1160._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    auVar40 = ZEXT1664(auVar1);
    local_1744 = local_174c;
    local_1680 = in_R9D;
    local_167c = in_R8D;
    local_1678 = in_ECX;
    local_1674 = in_EDX;
    local_1670 = in_RSI;
    local_1634 = local_16b0;
    local_1630 = local_1748;
    local_162c = local_174c;
    local_1400 = local_174c;
    local_13fc = local_174c;
    local_13f8 = local_174c;
    local_13f4 = local_174c;
    local_13f0 = local_174c;
    local_13ec = local_174c;
    local_13e8 = local_174c;
    local_13e4 = local_174c;
    local_13c0 = local_1748;
    local_13bc = local_1748;
    local_13b8 = local_1748;
    local_13b4 = local_1748;
    local_13b0 = local_1748;
    local_13ac = local_1748;
    local_13a8 = local_1748;
    local_13a4 = local_1748;
    local_1380 = local_16b0;
    local_137c = local_16b0;
    local_1378 = local_16b0;
    local_1374 = local_16b0;
    local_1370 = local_16b0;
    local_136c = local_16b0;
    local_1368 = local_16b0;
    local_1364 = local_16b0;
    local_1740 = local_1460._0_16_;
    auStack_1730 = local_1460._16_16_;
    local_1960 = local_1160._0_16_;
    auStack_1950 = local_1160._16_16_;
    local_1828 = parasail_result_new_trace(local_16a8,in_EDX,0x20,0x20);
    if (local_1828 == (parasail_result_t *)0x0) {
      local_1660 = (parasail_result_t *)0x0;
    }
    else {
      local_1828->flag = local_1828->flag | 0x8480802;
      uVar34 = 0;
      if (local_1680 != 0) {
        uVar34 = 8;
      }
      local_1828->flag = uVar34 | local_1828->flag;
      uVar34 = 0;
      if (in_stack_00000008 != 0) {
        uVar34 = 0x10;
      }
      local_1828->flag = uVar34 | local_1828->flag;
      uVar34 = 0;
      if (s1_end != 0) {
        uVar34 = 0x4000;
      }
      local_1828->flag = uVar34 | local_1828->flag;
      uVar34 = 0;
      if (s2_beg != 0) {
        uVar34 = 0x8000;
      }
      local_1828->flag = uVar34 | local_1828->flag;
      local_16c0 = parasail_memalign___m256i(0x20,(long)local_16a8);
      local_16c8 = parasail_memalign___m256i(0x20,(long)local_16a8);
      local_16d0 = parasail_memalign___m256i(0x20,(long)local_16a8);
      local_16d8 = parasail_memalign___m256i(0x20,(long)local_16a8);
      local_16e0 = parasail_memalign___m256i(0x20,(long)local_16a8);
      local_16e8 = parasail_memalign___m256i(0x20,(long)local_16a8);
      local_16f0 = parasail_memalign_int32_t(0x20,(long)(local_1674 + 1));
      if (local_16c0 == (__m256i *)0x0) {
        local_1660 = (parasail_result_t *)0x0;
      }
      else if (local_16c8 == (__m256i *)0x0) {
        local_1660 = (parasail_result_t *)0x0;
      }
      else if (local_16d0 == (__m256i *)0x0) {
        local_1660 = (parasail_result_t *)0x0;
      }
      else if (local_16d8 == (__m256i *)0x0) {
        local_1660 = (parasail_result_t *)0x0;
      }
      else if (local_16e0 == (__m256i *)0x0) {
        local_1660 = (parasail_result_t *)0x0;
      }
      else if (local_16e8 == (__m256i *)0x0) {
        local_1660 = (parasail_result_t *)0x0;
      }
      else if (local_16f0 == (int32_t *)0x0) {
        local_1660 = (parasail_result_t *)0x0;
      }
      else {
        local_1964 = 0;
        for (local_1684 = 0; (int)local_1684 < local_16a8; local_1684 = local_1684 + 1) {
          for (local_1968 = 0; local_1968 < local_16a4; local_1968 = local_1968 + 1) {
            if (local_1680 == 0) {
              local_1ee0 = -(local_167c * (local_1968 * local_16a8 + local_1684)) - local_1678;
            }
            else {
              local_1ee0 = 0;
            }
            local_1ee8 = local_1ee0;
            if ((long)local_1ee0 < -0x80000000) {
              local_1ee8 = -0x80000000;
            }
            *(int *)((long)&local_19a0 + (long)local_1968 * 4) = local_1ee8;
            in_stack_ffffffffffffe110 = (long)local_1ee0 - (long)(int)local_1678;
            if (in_stack_ffffffffffffe110 < -0x80000000) {
              in_stack_ffffffffffffe110 = -0x80000000;
            }
            *(int *)((long)&local_19c0 + (long)local_1968 * 4) = (int)in_stack_ffffffffffffe110;
          }
          local_e70 = local_16c0 + local_1964;
          (*local_e70)[0] = local_19a0;
          (*local_e70)[1] = lStack_1998;
          (*local_e70)[2] = lStack_1990;
          (*local_e70)[3] = lStack_1988;
          local_ea8 = local_16d0 + local_1964;
          (*local_ea8)[0] = local_19c0;
          (*local_ea8)[1] = lStack_19b8;
          (*local_ea8)[2] = lStack_19b0;
          (*local_ea8)[3] = lStack_19a8;
          local_ee8 = local_16d8 + local_1964;
          (*local_ee8)[0] = local_19c0;
          (*local_ee8)[1] = lStack_19b8;
          (*local_ee8)[2] = lStack_19b0;
          (*local_ee8)[3] = lStack_19a8;
          local_1964 = local_1964 + 1;
        }
        *local_16f0 = 0;
        for (local_1684 = 1; (int)local_1684 <= local_1674; local_1684 = local_1684 + 1) {
          if (s1_end == 0) {
            in_stack_ffffffffffffe10c = -(local_167c * (local_1684 + -1)) - local_1678;
          }
          else {
            in_stack_ffffffffffffe10c = 0;
          }
          in_stack_ffffffffffffe100 = (long)in_stack_ffffffffffffe10c;
          if (in_stack_ffffffffffffe100 < -0x80000000) {
            in_stack_ffffffffffffe100 = -0x80000000;
          }
          local_16f0[(int)local_1684] = (int32_t)in_stack_ffffffffffffe100;
        }
        local_1684 = 0;
        while( true ) {
          if (local_16a8 <= (int)local_1684) break;
          alVar6[0]._4_4_ = in_stack_ffffffffffffe0fc;
          alVar6[0]._0_4_ = in_stack_ffffffffffffe0f8;
          alVar6[1] = in_stack_ffffffffffffe100;
          alVar6[2]._0_4_ = in_stack_ffffffffffffe108;
          alVar6[2]._4_4_ = in_stack_ffffffffffffe10c;
          alVar6[3] = in_stack_ffffffffffffe110;
          arr_store((__m256i *)CONCAT44(uVar42,uVar41),alVar6,
                    (int32_t)((ulong)in_stack_ffffffffffffe0f0 >> 0x20),
                    (int32_t)in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0ec);
          local_1684 = local_1684 + 1;
        }
        for (local_1688 = 0; palVar33 = local_16c8, palVar32 = local_16e0, local_1688 < local_1674;
            local_1688 = local_1688 + 1) {
          local_1a60._8_8_ = uStack_1778;
          local_1a60._0_8_ = local_1780;
          local_1a60._16_8_ = uStack_1770;
          local_1a60._24_8_ = uStack_1768;
          local_e08 = local_16c0 + (local_16a8 + -1);
          auVar4 = vperm2i128_avx2(auVar40._0_32_,(undefined1  [32])*local_e08,0x28);
          auVar4 = vpalignr_avx2((undefined1  [32])*local_e08,auVar4,0xc);
          auVar40 = ZEXT1664(ZEXT416((uint)local_16f0[local_1688]));
          local_1ae0 = (__m256i)vpblendd_avx2(auVar4,ZEXT1632(ZEXT416((uint)local_16f0[local_1688]))
                                              ,1);
          lVar36 = local_16b8 +
                   (long)(*(int *)(*(long *)(local_16a0 + 0x10) +
                                  (ulong)*(byte *)(local_1670 + local_1688) * 4) * local_16a8) *
                   0x20;
          local_16c8 = local_16c0;
          local_16c0 = palVar33;
          local_16e0 = local_16d8;
          local_16d8 = palVar32;
          local_1684 = 0;
          while( true ) {
            if (local_16a8 <= (int)local_1684) break;
            local_e10 = local_16d0 + (int)local_1684;
            auVar31 = *(undefined1 (*) [24])*local_e10;
            lVar5 = (*local_e10)[3];
            alVar7 = *local_e10;
            alVar6 = *local_e10;
            local_e18 = (undefined1 (*) [32])(lVar36 + (long)(int)local_1684 * 0x20);
            local_dc0 = *(undefined8 *)*local_e18;
            uStack_db8 = *(undefined8 *)(*local_e18 + 8);
            uStack_db0 = *(undefined8 *)(*local_e18 + 0x10);
            uStack_da8 = *(undefined8 *)(*local_e18 + 0x18);
            local_da0 = local_1ae0[0];
            lStack_d98 = local_1ae0[1];
            lStack_d90 = local_1ae0[2];
            lStack_d88 = local_1ae0[3];
            auVar4 = vpaddd_avx2((undefined1  [32])local_1ae0,*local_e18);
            local_1b00 = auVar4._0_8_;
            uStack_1af8 = auVar4._8_8_;
            uStack_1af0 = auVar4._16_8_;
            uStack_1ae8 = auVar4._24_8_;
            local_1a20 = auVar31._0_8_;
            lStack_1a18 = auVar31._8_8_;
            lStack_1a10 = auVar31._16_8_;
            local_ae0 = local_1b00;
            uStack_ad8 = uStack_1af8;
            uStack_ad0 = uStack_1af0;
            uStack_ac8 = uStack_1ae8;
            local_b00 = local_1a20;
            uStack_af8 = lStack_1a18;
            uStack_af0 = lStack_1a10;
            auVar39 = vpmaxsd_avx2(auVar4,(undefined1  [32])*local_e10);
            local_1ae0[0] = auVar39._0_8_;
            local_1ae0[1] = auVar39._8_8_;
            local_1ae0[2] = auVar39._16_8_;
            local_1ae0[3] = auVar39._24_8_;
            local_b20 = local_1ae0[0];
            uStack_b18 = local_1ae0[1];
            uStack_b10 = local_1ae0[2];
            uStack_b08 = local_1ae0[3];
            local_b40 = local_1a60._0_8_;
            uStack_b38 = local_1a60._8_8_;
            uStack_b30 = local_1a60._16_8_;
            uStack_b28 = local_1a60._24_8_;
            auVar3 = vpmaxsd_avx2(auVar39,local_1a60);
            local_f28 = local_16c0 + (int)local_1684;
            local_1ae0[0] = auVar3._0_8_;
            local_1ae0[1] = auVar3._8_8_;
            local_1ae0[2] = auVar3._16_8_;
            local_1ae0[3] = auVar3._24_8_;
            local_f60 = local_1ae0[0];
            lStack_f58 = local_1ae0[1];
            lStack_f50 = local_1ae0[2];
            lStack_f48 = local_1ae0[3];
            (*local_f28)[0] = local_1ae0[0];
            (*local_f28)[1] = local_1ae0[1];
            (*local_f28)[2] = local_1ae0[2];
            (*local_f28)[3] = local_1ae0[3];
            local_b60 = local_17e0._0_8_;
            uStack_b58 = local_17e0._8_8_;
            uStack_b50 = local_17e0._16_8_;
            uStack_b48 = local_17e0._24_8_;
            local_b80 = local_1ae0[0];
            lStack_b78 = local_1ae0[1];
            lStack_b70 = local_1ae0[2];
            lStack_b68 = local_1ae0[3];
            local_17e0 = vpmaxsd_avx2(local_17e0,auVar3);
            local_9e0 = local_17c0._0_8_;
            uStack_9d8 = local_17c0._8_8_;
            uStack_9d0 = local_17c0._16_8_;
            uStack_9c8 = local_17c0._24_8_;
            local_a00 = local_1ae0[0];
            lStack_9f8 = local_1ae0[1];
            lStack_9f0 = local_1ae0[2];
            lStack_9e8 = local_1ae0[3];
            auVar39 = vpminsd_avx2(local_17c0,auVar3);
            local_17c0._0_8_ = auVar39._0_8_;
            local_17c0._8_8_ = auVar39._8_8_;
            local_17c0._16_8_ = auVar39._16_8_;
            local_17c0._24_8_ = auVar39._24_8_;
            local_a20 = local_17c0._0_8_;
            uStack_a18 = local_17c0._8_8_;
            uStack_a10 = local_17c0._16_8_;
            uStack_a08 = local_17c0._24_8_;
            local_a40 = local_1a20;
            uStack_a38 = lStack_1a18;
            uStack_a30 = lStack_1a10;
            auVar39 = vpminsd_avx2(auVar39,(undefined1  [32])alVar6);
            local_17c0._0_8_ = auVar39._0_8_;
            local_17c0._8_8_ = auVar39._8_8_;
            local_17c0._16_8_ = auVar39._16_8_;
            local_17c0._24_8_ = auVar39._24_8_;
            local_a60 = local_17c0._0_8_;
            uStack_a58 = local_17c0._8_8_;
            uStack_a50 = local_17c0._16_8_;
            uStack_a48 = local_17c0._24_8_;
            local_a80 = local_1a60._0_8_;
            uStack_a78 = local_1a60._8_8_;
            uStack_a70 = local_1a60._16_8_;
            uStack_a68 = local_1a60._24_8_;
            auVar38 = vpminsd_avx2(auVar39,local_1a60);
            local_17c0 = auVar38;
            lStack_ae8 = lVar5;
            lStack_a28 = lVar5;
            arr_load((__m256i *)((local_1828->field_4).rowcols)->score_row,
                     (__m256i *)(ulong)local_1684,local_16a8,local_1688,(int32_t)uVar37);
            local_1500 = local_1ae0[0];
            lStack_14f8 = local_1ae0[1];
            lStack_14f0 = local_1ae0[2];
            lStack_14e8 = local_1ae0[3];
            local_1520 = local_1b00;
            uStack_1518 = uStack_1af8;
            uStack_1510 = uStack_1af0;
            uStack_1508 = uStack_1ae8;
            auVar4 = vpcmpeqd_avx2(auVar3,auVar4);
            local_1540 = local_1ae0[0];
            lStack_1538 = local_1ae0[1];
            lStack_1530 = local_1ae0[2];
            lStack_1528 = local_1ae0[3];
            local_1560 = local_1a60._0_8_;
            uStack_1558 = local_1a60._8_8_;
            uStack_1550 = local_1a60._16_8_;
            uStack_1548 = local_1a60._24_8_;
            auVar39 = vpcmpeqd_avx2(auVar3,local_1a60);
            local_1b80 = auVar39._0_8_;
            uStack_1b78 = auVar39._8_8_;
            uStack_1b70 = auVar39._16_8_;
            uStack_1b68 = auVar39._24_8_;
            local_740 = local_1860;
            uStack_738 = uStack_1858;
            uStack_730 = uStack_1850;
            uStack_728 = uStack_1848;
            local_760 = local_1880;
            uStack_758 = uStack_1878;
            uStack_750 = uStack_1870;
            uStack_748 = uStack_1868;
            local_780 = local_1b80;
            uStack_778 = uStack_1b78;
            uStack_770 = uStack_1b70;
            uStack_768 = uStack_1b68;
            auVar19._8_8_ = uStack_1858;
            auVar19._0_8_ = local_1860;
            auVar19._16_8_ = uStack_1850;
            auVar19._24_8_ = uStack_1848;
            auVar18._8_8_ = uStack_1878;
            auVar18._0_8_ = local_1880;
            auVar18._16_8_ = uStack_1870;
            auVar18._24_8_ = uStack_1868;
            local_7a0 = vpblendvb_avx2(auVar19,auVar18,auVar39);
            local_1b60 = auVar4._0_8_;
            uStack_1b58 = auVar4._8_8_;
            uStack_1b50 = auVar4._16_8_;
            uStack_1b48 = auVar4._24_8_;
            local_7c0 = local_18a0;
            uStack_7b8 = uStack_1898;
            uStack_7b0 = uStack_1890;
            uStack_7a8 = uStack_1888;
            local_7e0 = local_1b60;
            uStack_7d8 = uStack_1b58;
            uStack_7d0 = uStack_1b50;
            uStack_7c8 = uStack_1b48;
            auVar17._8_8_ = uStack_1898;
            auVar17._0_8_ = local_18a0;
            auVar17._16_8_ = uStack_1890;
            auVar17._24_8_ = uStack_1888;
            auVar4 = vpblendvb_avx2(local_7a0,auVar17,auVar4);
            local_f68 = local_16e8 + (int)local_1684;
            local_1ba0 = auVar4._0_8_;
            lStack_1b98 = auVar4._8_8_;
            lStack_1b90 = auVar4._16_8_;
            lStack_1b88 = auVar4._24_8_;
            local_fa0 = local_1ba0;
            lStack_f98 = lStack_1b98;
            lStack_f90 = lStack_1b90;
            lStack_f88 = lStack_1b88;
            (*local_f68)[0] = local_1ba0;
            (*local_f68)[1] = lStack_1b98;
            (*local_f68)[2] = lStack_1b90;
            (*local_f68)[3] = lStack_1b88;
            local_1b40 = auVar38._0_8_;
            uStack_1b38 = auVar38._8_8_;
            uStack_1b30 = auVar38._16_8_;
            uStack_1b28 = auVar38._24_8_;
            local_5c0 = local_1ba0;
            lStack_5b8 = lStack_1b98;
            lStack_5b0 = lStack_1b90;
            lStack_5a8 = lStack_1b88;
            local_5e0 = local_1b40;
            uStack_5d8 = uStack_1b38;
            uStack_5d0 = uStack_1b30;
            uStack_5c8 = uStack_1b28;
            vpor_avx2(auVar4,auVar38);
            vH_00[0]._4_4_ = in_stack_ffffffffffffe0fc;
            vH_00[0]._0_4_ = in_stack_ffffffffffffe0f8;
            vH_00[1] = in_stack_ffffffffffffe100;
            vH_00[2]._0_4_ = in_stack_ffffffffffffe108;
            vH_00[2]._4_4_ = in_stack_ffffffffffffe10c;
            vH_00[3] = in_stack_ffffffffffffe110;
            arr_store((__m256i *)CONCAT44(uVar42,uVar41),vH_00,
                      (int32_t)((ulong)in_stack_ffffffffffffe0f0 >> 0x20),
                      (int32_t)in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0ec);
            local_3c0 = local_1ae0[0];
            lStack_3b8 = local_1ae0[1];
            lStack_3b0 = local_1ae0[2];
            lStack_3a8 = local_1ae0[3];
            local_3e0 = local_1720;
            uStack_3d8 = uStack_1718;
            uStack_3d0 = uStack_1710;
            uStack_3c8 = uStack_1708;
            auVar25._8_8_ = uStack_1718;
            auVar25._0_8_ = local_1720;
            auVar25._16_8_ = uStack_1710;
            auVar25._24_8_ = uStack_1708;
            local_1a00 = vpsubd_avx2(auVar3,auVar25);
            local_400 = local_1a20;
            uStack_3f8 = lStack_1a18;
            uStack_3f0 = lStack_1a10;
            auVar38._16_8_ = auStack_1730._0_8_;
            auVar38._0_16_ = local_1740;
            auVar38._24_8_ = auStack_1730._8_8_;
            auVar4 = vpsubd_avx2((undefined1  [32])alVar7,auVar38);
            local_1a40 = auVar4._0_8_;
            uStack_1a38 = auVar4._8_8_;
            uStack_1a30 = auVar4._16_8_;
            uStack_1a28 = auVar4._24_8_;
            local_ba0 = local_1a00._0_8_;
            uStack_b98 = local_1a00._8_8_;
            uStack_b90 = local_1a00._16_8_;
            uStack_b88 = local_1a00._24_8_;
            local_bc0 = local_1a40;
            uStack_bb8 = uStack_1a38;
            uStack_bb0 = uStack_1a30;
            uStack_ba8 = uStack_1a28;
            auVar4 = vpmaxsd_avx2(local_1a00,auVar4);
            local_fa8 = local_16d0 + (int)local_1684;
            local_1a20 = auVar4._0_8_;
            lStack_1a18 = auVar4._8_8_;
            lStack_1a10 = auVar4._16_8_;
            lStack_1a08 = auVar4._24_8_;
            local_fe0 = local_1a20;
            lStack_fd8 = lStack_1a18;
            lStack_fd0 = lStack_1a10;
            lStack_fc8 = lStack_1a08;
            (*local_fa8)[0] = local_1a20;
            (*local_fa8)[1] = lStack_1a18;
            (*local_fa8)[2] = lStack_1a10;
            (*local_fa8)[3] = lStack_1a08;
            local_e20 = local_16e0 + (int)local_1684;
            auVar31 = *(undefined1 (*) [24])*local_e20;
            lStack_428 = (*local_e20)[3];
            local_1bc0 = auVar31._0_8_;
            lStack_1bb8 = auVar31._8_8_;
            lStack_1bb0 = auVar31._16_8_;
            local_440 = local_1bc0;
            uStack_438 = lStack_1bb8;
            uStack_430 = lStack_1bb0;
            auVar3._16_8_ = auStack_1730._0_8_;
            auVar3._0_16_ = local_1740;
            auVar3._24_8_ = auStack_1730._8_8_;
            auVar39 = vpsubd_avx2((undefined1  [32])*local_e20,auVar3);
            local_1be0 = auVar39._0_8_;
            uStack_1bd8 = auVar39._8_8_;
            uStack_1bd0 = auVar39._16_8_;
            uStack_1bc8 = auVar39._24_8_;
            local_be0 = local_1a00._0_8_;
            uStack_bd8 = local_1a00._8_8_;
            uStack_bd0 = local_1a00._16_8_;
            uStack_bc8 = local_1a00._24_8_;
            local_c00 = local_1be0;
            uStack_bf8 = uStack_1bd8;
            uStack_bf0 = uStack_1bd0;
            uStack_be8 = uStack_1bc8;
            auVar4 = vpmaxsd_avx2(local_1a00,auVar39);
            local_fe8 = local_16d8 + (int)local_1684;
            local_1bc0 = auVar4._0_8_;
            lStack_1bb8 = auVar4._8_8_;
            lStack_1bb0 = auVar4._16_8_;
            lStack_1ba8 = auVar4._24_8_;
            local_1020 = local_1bc0;
            lStack_1018 = lStack_1bb8;
            lStack_1010 = lStack_1bb0;
            lStack_1008 = lStack_1ba8;
            (*local_fe8)[0] = local_1bc0;
            (*local_fe8)[1] = lStack_1bb8;
            (*local_fe8)[2] = lStack_1bb0;
            (*local_fe8)[3] = lStack_1ba8;
            lStack_3e8 = lVar5;
            local_420 = local_1740;
            auStack_410 = auStack_1730;
            local_460 = local_1740;
            auStack_450 = auStack_1730;
            if (local_1688 + 1 < local_1674) {
              local_1c0 = local_1a00._0_8_;
              uStack_1b8 = local_1a00._8_8_;
              uStack_1b0 = local_1a00._16_8_;
              uStack_1a8 = local_1a00._24_8_;
              local_1e0 = local_1be0;
              uStack_1d8 = uStack_1bd8;
              uStack_1d0 = uStack_1bd0;
              uStack_1c8 = uStack_1bc8;
              auVar4 = vpcmpgtd_avx2(local_1a00,auVar39);
              local_1c00 = auVar4._0_8_;
              uStack_1bf8 = auVar4._8_8_;
              uStack_1bf0 = auVar4._16_8_;
              uStack_1be8 = auVar4._24_8_;
              local_800 = local_18e0;
              uStack_7f8 = uStack_18d8;
              uStack_7f0 = uStack_18d0;
              uStack_7e8 = uStack_18c8;
              local_820 = local_18c0;
              uStack_818 = uStack_18b8;
              uStack_810 = uStack_18b0;
              uStack_808 = uStack_18a8;
              local_840 = local_1c00;
              uStack_838 = uStack_1bf8;
              uStack_830 = uStack_1bf0;
              uStack_828 = uStack_1be8;
              auVar16._8_8_ = uStack_18d8;
              auVar16._0_8_ = local_18e0;
              auVar16._16_8_ = uStack_18d0;
              auVar16._24_8_ = uStack_18c8;
              auVar15._8_8_ = uStack_18b8;
              auVar15._0_8_ = local_18c0;
              auVar15._16_8_ = uStack_18b0;
              auVar15._24_8_ = uStack_18a8;
              vpblendvb_avx2(auVar16,auVar15,auVar4);
              alVar7[0]._4_4_ = in_stack_ffffffffffffe0fc;
              alVar7[0]._0_4_ = in_stack_ffffffffffffe0f8;
              alVar7[1] = in_stack_ffffffffffffe100;
              alVar7[2]._0_4_ = in_stack_ffffffffffffe108;
              alVar7[2]._4_4_ = in_stack_ffffffffffffe10c;
              alVar7[3] = in_stack_ffffffffffffe110;
              arr_store((__m256i *)CONCAT44(uVar42,uVar41),alVar7,
                        (int32_t)((ulong)in_stack_ffffffffffffe0f0 >> 0x20),
                        (int32_t)in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0ec);
            }
            local_480 = local_1a60._0_8_;
            uStack_478 = local_1a60._8_8_;
            uStack_470 = local_1a60._16_8_;
            uStack_468 = local_1a60._24_8_;
            auVar24._16_8_ = auStack_1730._0_8_;
            auVar24._0_16_ = local_1740;
            auVar24._24_8_ = auStack_1730._8_8_;
            local_1a80 = vpsubd_avx2(local_1a60,auVar24);
            local_c20 = local_1a00._0_8_;
            uStack_c18 = local_1a00._8_8_;
            uStack_c10 = local_1a00._16_8_;
            uStack_c08 = local_1a00._24_8_;
            local_c40 = local_1a80._0_8_;
            uStack_c38 = local_1a80._8_8_;
            uStack_c30 = local_1a80._16_8_;
            uStack_c28 = local_1a80._24_8_;
            auVar40 = ZEXT3264(local_1a80);
            local_1a60 = vpmaxsd_avx2(local_1a00,local_1a80);
            local_4a0 = local_1740;
            auStack_490 = auStack_1730;
            if ((int)(local_1684 + 1) < local_16a8) {
              auVar39 = local_1a60;
              arr_load((__m256i *)((local_1828->field_4).rowcols)->score_row,
                       (__m256i *)(ulong)(local_1684 + 1),local_16a8,local_1688,(int32_t)uVar37);
              local_200 = local_1a00._0_8_;
              uStack_1f8 = local_1a00._8_8_;
              uStack_1f0 = local_1a00._16_8_;
              uStack_1e8 = local_1a00._24_8_;
              local_220 = local_1a80._0_8_;
              uStack_218 = local_1a80._8_8_;
              uStack_210 = local_1a80._16_8_;
              uStack_208 = local_1a80._24_8_;
              auVar4 = vpcmpgtd_avx2(local_1a00,local_1a80);
              local_1c60 = auVar4._0_8_;
              uStack_1c58 = auVar4._8_8_;
              uStack_1c50 = auVar4._16_8_;
              uStack_1c48 = auVar4._24_8_;
              local_860 = local_1920;
              uStack_858 = uStack_1918;
              uStack_850 = uStack_1910;
              uStack_848 = uStack_1908;
              local_880 = local_1900;
              uStack_878 = uStack_18f8;
              uStack_870 = uStack_18f0;
              uStack_868 = uStack_18e8;
              local_8a0 = local_1c60;
              uStack_898 = uStack_1c58;
              uStack_890 = uStack_1c50;
              uStack_888 = uStack_1c48;
              auVar14._8_8_ = uStack_1918;
              auVar14._0_8_ = local_1920;
              auVar14._16_8_ = uStack_1910;
              auVar14._24_8_ = uStack_1908;
              auVar13._8_8_ = uStack_18f8;
              auVar13._0_8_ = local_1900;
              auVar13._16_8_ = uStack_18f0;
              auVar13._24_8_ = uStack_18e8;
              local_600 = vpblendvb_avx2(auVar14,auVar13,auVar4);
              auVar40 = ZEXT3264(local_600);
              local_1c40 = auVar39._0_8_;
              uStack_1c38 = auVar39._8_8_;
              uStack_1c30 = auVar39._16_8_;
              uStack_1c28 = auVar39._24_8_;
              local_620 = local_1c40;
              uStack_618 = uStack_1c38;
              uStack_610 = uStack_1c30;
              uStack_608 = uStack_1c28;
              vpor_avx2(local_600,auVar39);
              vH_01[0]._4_4_ = in_stack_ffffffffffffe0fc;
              vH_01[0]._0_4_ = in_stack_ffffffffffffe0f8;
              vH_01[1] = in_stack_ffffffffffffe100;
              vH_01[2]._0_4_ = in_stack_ffffffffffffe108;
              vH_01[2]._4_4_ = in_stack_ffffffffffffe10c;
              vH_01[3] = in_stack_ffffffffffffe110;
              arr_store((__m256i *)CONCAT44(uVar42,uVar41),vH_01,
                        (int32_t)((ulong)in_stack_ffffffffffffe0f0 >> 0x20),
                        (int32_t)in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0ec);
            }
            local_e28 = local_16c8 + (int)local_1684;
            local_1ae0 = *local_e28;
            local_1684 = local_1684 + 1;
          }
          local_1ac0 = local_1a80;
          local_1aa0 = local_1a60;
          for (local_168c = 0; local_168c < local_16a4; local_168c = local_168c + 1) {
            if (s1_end == 0) {
              in_stack_ffffffffffffe0fc = local_16f0[local_1688 + 1] - local_1678;
            }
            else {
              in_stack_ffffffffffffe0fc = -local_1678;
            }
            in_stack_ffffffffffffe0f0 = (long)in_stack_ffffffffffffe0fc;
            if (in_stack_ffffffffffffe0f0 < -0x80000000) {
              in_stack_ffffffffffffe0f0 = -0x80000000;
            }
            uVar34 = (uint)in_stack_ffffffffffffe0f0;
            local_e30 = local_16c8 + (local_16a8 + -1);
            auVar4 = vperm2i128_avx2(auVar40._0_32_,(undefined1  [32])*local_e30,0x28);
            auVar4 = vpalignr_avx2((undefined1  [32])*local_e30,auVar4,0xc);
            local_1cc0 = (__m256i)vpblendd_avx2(auVar4,ZEXT432((uint)local_16f0[local_1688]),1);
            auVar4 = vperm2i128_avx2(ZEXT432((uint)local_16f0[local_1688]),local_1a00,0x28);
            auVar4 = vpalignr_avx2(local_1a00,auVar4,0xc);
            local_1a00 = vpblendd_avx2(auVar4,ZEXT432(uVar34),1);
            auVar4 = vperm2i128_avx2(ZEXT432(uVar34),local_1a80,0x28);
            auVar4 = vpalignr_avx2(local_1a80,auVar4,0xc);
            local_1a80 = vpblendd_avx2(auVar4,ZEXT432(local_1744),1);
            auVar4 = vperm2i128_avx2(ZEXT432(local_1744),local_1a60,0x28);
            auVar4 = vpalignr_avx2(local_1a60,auVar4,0xc);
            local_1a60 = vpblendd_avx2(auVar4,ZEXT432(uVar34),1);
            auVar4 = vperm2i128_avx2(ZEXT432(uVar34),local_1ac0,0x28);
            auVar4 = vpalignr_avx2(local_1ac0,auVar4,0xc);
            local_1ac0 = vpblendd_avx2(auVar4,ZEXT432(local_1744),1);
            auVar4 = vperm2i128_avx2(ZEXT432(local_1744),local_1aa0,0x28);
            auVar4 = vpalignr_avx2(local_1aa0,auVar4,0xc);
            auVar40 = ZEXT1664(ZEXT416(uVar34));
            local_1aa0 = vpblendd_avx2(auVar4,ZEXT1632(ZEXT416(uVar34)),1);
            for (local_1684 = 0; (int)local_1684 < local_16a8; local_1684 = local_1684 + 1) {
              local_e38 = local_16c0 + (int)local_1684;
              auVar31 = *(undefined1 (*) [24])*local_e38;
              lStack_c48 = (*local_e38)[3];
              local_1ae0[0] = auVar31._0_8_;
              local_1ae0[1] = auVar31._8_8_;
              local_1ae0[2] = auVar31._16_8_;
              local_c60 = local_1ae0[0];
              uStack_c58 = local_1ae0[1];
              uStack_c50 = local_1ae0[2];
              local_c80 = local_1a60._0_8_;
              uStack_c78 = local_1a60._8_8_;
              uStack_c70 = local_1a60._16_8_;
              uStack_c68 = local_1a60._24_8_;
              auVar3 = vpmaxsd_avx2((undefined1  [32])*local_e38,local_1a60);
              local_1028 = local_16c0 + (int)local_1684;
              local_1ae0[0] = auVar3._0_8_;
              local_1ae0[1] = auVar3._8_8_;
              local_1ae0[2] = auVar3._16_8_;
              local_1ae0[3] = auVar3._24_8_;
              local_1060 = local_1ae0[0];
              lStack_1058 = local_1ae0[1];
              lStack_1050 = local_1ae0[2];
              lStack_1048 = local_1ae0[3];
              (*local_1028)[0] = local_1ae0[0];
              (*local_1028)[1] = local_1ae0[1];
              (*local_1028)[2] = local_1ae0[2];
              (*local_1028)[3] = local_1ae0[3];
              local_aa0 = local_17c0._0_8_;
              uStack_a98 = local_17c0._8_8_;
              uStack_a90 = local_17c0._16_8_;
              uStack_a88 = local_17c0._24_8_;
              local_ac0 = local_1ae0[0];
              lStack_ab8 = local_1ae0[1];
              lStack_ab0 = local_1ae0[2];
              lStack_aa8 = local_1ae0[3];
              local_17c0 = vpminsd_avx2(local_17c0,auVar3);
              local_ca0 = local_17e0._0_8_;
              uStack_c98 = local_17e0._8_8_;
              uStack_c90 = local_17e0._16_8_;
              uStack_c88 = local_17e0._24_8_;
              local_cc0 = local_1ae0[0];
              lStack_cb8 = local_1ae0[1];
              lStack_cb0 = local_1ae0[2];
              lStack_ca8 = local_1ae0[3];
              local_17e0 = vpmaxsd_avx2(local_17e0,auVar3);
              local_e40 = (undefined1 (*) [32])(lVar36 + (long)(int)local_1684 * 0x20);
              local_e00 = *(undefined8 *)*local_e40;
              uStack_df8 = *(undefined8 *)(*local_e40 + 8);
              uStack_df0 = *(undefined8 *)(*local_e40 + 0x10);
              uStack_de8 = *(undefined8 *)(*local_e40 + 0x18);
              local_de0 = local_1cc0[0];
              lStack_dd8 = local_1cc0[1];
              lStack_dd0 = local_1cc0[2];
              lStack_dc8 = local_1cc0[3];
              auVar4 = vpaddd_avx2((undefined1  [32])local_1cc0,*local_e40);
              local_1cc0[0] = auVar4._0_8_;
              local_1cc0[1] = auVar4._8_8_;
              local_1cc0[2] = auVar4._16_8_;
              local_1cc0[3] = auVar4._24_8_;
              local_1580 = local_1ae0[0];
              lStack_1578 = local_1ae0[1];
              lStack_1570 = local_1ae0[2];
              lStack_1568 = local_1ae0[3];
              local_15a0 = local_1cc0[0];
              uStack_1598 = local_1cc0[1];
              uStack_1590 = local_1cc0[2];
              uStack_1588 = local_1cc0[3];
              auVar4 = vpcmpeqd_avx2(auVar3,auVar4);
              local_15c0 = local_1ae0[0];
              lStack_15b8 = local_1ae0[1];
              lStack_15b0 = local_1ae0[2];
              lStack_15a8 = local_1ae0[3];
              local_15e0 = local_1a60._0_8_;
              uStack_15d8 = local_1a60._8_8_;
              uStack_15d0 = local_1a60._16_8_;
              uStack_15c8 = local_1a60._24_8_;
              auVar39 = vpcmpeqd_avx2(auVar3,local_1a60);
              local_1d20 = auVar4._0_8_;
              uStack_1d18 = auVar4._8_8_;
              uStack_1d10 = auVar4._16_8_;
              uStack_1d08 = auVar4._24_8_;
              local_1d40 = auVar39._0_8_;
              uStack_1d38 = auVar39._8_8_;
              uStack_1d30 = auVar39._16_8_;
              uStack_1d28 = auVar39._24_8_;
              local_180 = local_1d20;
              uStack_178 = uStack_1d18;
              uStack_170 = uStack_1d10;
              uStack_168 = uStack_1d08;
              local_1a0 = local_1d40;
              uStack_198 = uStack_1d38;
              uStack_190 = uStack_1d30;
              uStack_188 = uStack_1d28;
              auVar4 = vpandn_avx2(auVar4,auVar39);
              auVar38 = auVar4;
              arr_load((__m256i *)((local_1828->field_4).rowcols)->score_row,
                       (__m256i *)(ulong)local_1684,local_16a8,local_1688,(int32_t)uVar37);
              local_e48 = local_16e8 + (int)local_1684;
              auVar31 = *(undefined1 (*) [24])*local_e48;
              lStack_8a8 = (*local_e48)[3];
              local_1d00 = auVar31._0_8_;
              lStack_1cf8 = auVar31._8_8_;
              lStack_1cf0 = auVar31._16_8_;
              local_1d60 = auVar4._0_8_;
              uStack_1d58 = auVar4._8_8_;
              uStack_1d50 = auVar4._16_8_;
              uStack_1d48 = auVar4._24_8_;
              local_8c0 = local_1d00;
              uStack_8b8 = lStack_1cf8;
              uStack_8b0 = lStack_1cf0;
              local_8e0 = local_1880;
              uStack_8d8 = uStack_1878;
              uStack_8d0 = uStack_1870;
              uStack_8c8 = uStack_1868;
              local_900 = local_1d60;
              uStack_8f8 = uStack_1d58;
              uStack_8f0 = uStack_1d50;
              uStack_8e8 = uStack_1d48;
              auVar12._8_8_ = uStack_1878;
              auVar12._0_8_ = local_1880;
              auVar12._16_8_ = uStack_1870;
              auVar12._24_8_ = uStack_1868;
              auVar39 = vpblendvb_avx2((undefined1  [32])*local_e48,auVar12,auVar4);
              local_1068 = local_16e8 + (int)local_1684;
              local_1d00 = auVar39._0_8_;
              lStack_1cf8 = auVar39._8_8_;
              lStack_1cf0 = auVar39._16_8_;
              lStack_1ce8 = auVar39._24_8_;
              local_10a0 = local_1d00;
              lStack_1098 = lStack_1cf8;
              lStack_1090 = lStack_1cf0;
              lStack_1088 = lStack_1ce8;
              (*local_1068)[0] = local_1d00;
              (*local_1068)[1] = lStack_1cf8;
              (*local_1068)[2] = lStack_1cf0;
              (*local_1068)[3] = lStack_1ce8;
              local_1ce0 = auVar38._0_8_;
              uStack_1cd8 = auVar38._8_8_;
              uStack_1cd0 = auVar38._16_8_;
              uStack_1cc8 = auVar38._24_8_;
              local_c0 = local_1ce0;
              uStack_b8 = uStack_1cd8;
              uStack_b0 = uStack_1cd0;
              uStack_a8 = uStack_1cc8;
              local_e0 = local_1940;
              uStack_d8 = uStack_1938;
              uStack_d0 = uStack_1930;
              uStack_c8 = uStack_1928;
              auVar30._8_8_ = uStack_1938;
              auVar30._0_8_ = local_1940;
              auVar30._16_8_ = uStack_1930;
              auVar30._24_8_ = uStack_1928;
              auVar4 = vpand_avx2(auVar38,auVar30);
              local_1ce0 = auVar4._0_8_;
              uStack_1cd8 = auVar4._8_8_;
              uStack_1cd0 = auVar4._16_8_;
              uStack_1cc8 = auVar4._24_8_;
              local_640 = local_1ce0;
              uStack_638 = uStack_1cd8;
              uStack_630 = uStack_1cd0;
              uStack_628 = uStack_1cc8;
              local_660 = local_1d00;
              lStack_658 = lStack_1cf8;
              lStack_650 = lStack_1cf0;
              lStack_648 = lStack_1ce8;
              auVar4 = vpor_avx2(auVar4,auVar39);
              local_1ce0 = auVar4._0_8_;
              uStack_1cd8 = auVar4._8_8_;
              uStack_1cd0 = auVar4._16_8_;
              uStack_1cc8 = auVar4._24_8_;
              vH_02[0]._4_4_ = in_stack_ffffffffffffe0fc;
              vH_02[0]._0_4_ = in_stack_ffffffffffffe0f8;
              vH_02[1] = in_stack_ffffffffffffe100;
              vH_02[2]._0_4_ = in_stack_ffffffffffffe108;
              vH_02[2]._4_4_ = in_stack_ffffffffffffe10c;
              vH_02[3] = in_stack_ffffffffffffe110;
              arr_store((__m256i *)CONCAT44(uVar42,uVar41),vH_02,
                        (int32_t)((ulong)in_stack_ffffffffffffe0f0 >> 0x20),
                        (int32_t)in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0ec);
              arr_load((__m256i *)((local_1828->field_4).rowcols)->score_row,
                       (__m256i *)(ulong)local_1684,local_16a8,local_1688,(int32_t)uVar37);
              local_1d80._8_8_ = uStack_1cd8;
              local_1d80._0_8_ = local_1ce0;
              local_240 = local_1a00._0_8_;
              uStack_238 = local_1a00._8_8_;
              uStack_230 = local_1a00._16_8_;
              uStack_228 = local_1a00._24_8_;
              local_260 = local_1ac0._0_8_;
              uStack_258 = local_1ac0._8_8_;
              uStack_250 = local_1ac0._16_8_;
              uStack_248 = local_1ac0._24_8_;
              auVar4 = vpcmpgtd_avx2(local_1a00,local_1ac0);
              local_1da0 = auVar4._0_8_;
              uStack_1d98 = auVar4._8_8_;
              uStack_1d90 = auVar4._16_8_;
              uStack_1d88 = auVar4._24_8_;
              local_920 = local_1920;
              uStack_918 = uStack_1918;
              uStack_910 = uStack_1910;
              uStack_908 = uStack_1908;
              local_940 = local_1900;
              uStack_938 = uStack_18f8;
              uStack_930 = uStack_18f0;
              uStack_928 = uStack_18e8;
              local_960 = local_1da0;
              uStack_958 = uStack_1d98;
              uStack_950 = uStack_1d90;
              uStack_948 = uStack_1d88;
              auVar11._8_8_ = uStack_1918;
              auVar11._0_8_ = local_1920;
              auVar11._16_8_ = uStack_1910;
              auVar11._24_8_ = uStack_1908;
              auVar10._8_8_ = uStack_18f8;
              auVar10._0_8_ = local_1900;
              auVar10._16_8_ = uStack_18f0;
              auVar10._24_8_ = uStack_18e8;
              auVar39 = vpblendvb_avx2(auVar11,auVar10,auVar4);
              auVar29._16_8_ = uStack_1cd0;
              auVar29._0_16_ = local_1d80;
              auVar29._24_8_ = uStack_1cc8;
              auVar28._16_8_ = auStack_1950._0_8_;
              auVar28._0_16_ = local_1960;
              auVar28._24_8_ = auStack_1950._8_8_;
              auVar4 = vpand_avx2(auVar29,auVar28);
              local_1d80._0_8_ = auVar4._0_8_;
              local_1d80._8_8_ = auVar4._8_8_;
              uStack_1d70 = auVar4._16_8_;
              uStack_1d68 = auVar4._24_8_;
              local_1dc0 = auVar39._0_8_;
              uStack_1db8 = auVar39._8_8_;
              uStack_1db0 = auVar39._16_8_;
              uStack_1da8 = auVar39._24_8_;
              local_680 = local_1d80._0_8_;
              uStack_678 = local_1d80._8_8_;
              uStack_670 = uStack_1d70;
              uStack_668 = uStack_1d68;
              local_6a0 = local_1dc0;
              uStack_698 = uStack_1db8;
              uStack_690 = uStack_1db0;
              uStack_688 = uStack_1da8;
              vpor_avx2(auVar4,auVar39);
              vH_03[0]._4_4_ = in_stack_ffffffffffffe0fc;
              vH_03[0]._0_4_ = in_stack_ffffffffffffe0f8;
              vH_03[1] = in_stack_ffffffffffffe100;
              vH_03[2]._0_4_ = in_stack_ffffffffffffe108;
              vH_03[2]._4_4_ = in_stack_ffffffffffffe10c;
              vH_03[3] = in_stack_ffffffffffffe110;
              local_100 = local_1ce0;
              uStack_f8 = uStack_1cd8;
              uStack_f0 = uStack_1cd0;
              uStack_e8 = uStack_1cc8;
              local_120 = local_1960;
              auStack_110 = auStack_1950;
              arr_store((__m256i *)CONCAT44(uVar42,uVar41),vH_03,
                        (int32_t)((ulong)in_stack_ffffffffffffe0f0 >> 0x20),
                        (int32_t)in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0ec);
              local_4c0 = local_1ae0[0];
              lStack_4b8 = local_1ae0[1];
              lStack_4b0 = local_1ae0[2];
              lStack_4a8 = local_1ae0[3];
              local_4e0 = local_1720;
              uStack_4d8 = uStack_1718;
              uStack_4d0 = uStack_1710;
              uStack_4c8 = uStack_1708;
              auVar23._8_8_ = uStack_1718;
              auVar23._0_8_ = local_1720;
              auVar23._16_8_ = uStack_1710;
              auVar23._24_8_ = uStack_1708;
              local_1a00 = vpsubd_avx2(auVar3,auVar23);
              local_500 = local_1a60._0_8_;
              uStack_4f8 = local_1a60._8_8_;
              uStack_4f0 = local_1a60._16_8_;
              uStack_4e8 = local_1a60._24_8_;
              auVar22._16_8_ = auStack_1730._0_8_;
              auVar22._0_16_ = local_1740;
              auVar22._24_8_ = auStack_1730._8_8_;
              local_1a80 = vpsubd_avx2(local_1a60,auVar22);
              local_e50 = local_16e0 + (int)local_1684;
              auVar31 = *(undefined1 (*) [24])*local_e50;
              lStack_528 = (*local_e50)[3];
              local_1de0 = auVar31._0_8_;
              lStack_1dd8 = auVar31._8_8_;
              lStack_1dd0 = auVar31._16_8_;
              local_540 = local_1de0;
              uStack_538 = lStack_1dd8;
              uStack_530 = lStack_1dd0;
              auVar21._16_8_ = auStack_1730._0_8_;
              auVar21._0_16_ = local_1740;
              auVar21._24_8_ = auStack_1730._8_8_;
              auVar39 = vpsubd_avx2((undefined1  [32])*local_e50,auVar21);
              local_1e00 = auVar39._0_8_;
              uStack_1df8 = auVar39._8_8_;
              uStack_1df0 = auVar39._16_8_;
              uStack_1de8 = auVar39._24_8_;
              local_ce0 = local_1a00._0_8_;
              uStack_cd8 = local_1a00._8_8_;
              uStack_cd0 = local_1a00._16_8_;
              uStack_cc8 = local_1a00._24_8_;
              local_d00 = local_1e00;
              uStack_cf8 = uStack_1df8;
              uStack_cf0 = uStack_1df0;
              uStack_ce8 = uStack_1de8;
              auVar4 = vpmaxsd_avx2(local_1a00,auVar39);
              local_10a8 = local_16d8 + (int)local_1684;
              local_1de0 = auVar4._0_8_;
              lStack_1dd8 = auVar4._8_8_;
              lStack_1dd0 = auVar4._16_8_;
              lStack_1dc8 = auVar4._24_8_;
              local_10e0 = local_1de0;
              lStack_10d8 = lStack_1dd8;
              lStack_10d0 = lStack_1dd0;
              lStack_10c8 = lStack_1dc8;
              (*local_10a8)[0] = local_1de0;
              (*local_10a8)[1] = lStack_1dd8;
              (*local_10a8)[2] = lStack_1dd0;
              (*local_10a8)[3] = lStack_1dc8;
              local_520 = local_1740;
              auStack_510 = auStack_1730;
              local_560 = local_1740;
              auStack_550 = auStack_1730;
              if (local_1688 + 1 < local_1674) {
                local_280 = local_1a00._0_8_;
                uStack_278 = local_1a00._8_8_;
                uStack_270 = local_1a00._16_8_;
                uStack_268 = local_1a00._24_8_;
                local_2a0 = local_1e00;
                uStack_298 = uStack_1df8;
                uStack_290 = uStack_1df0;
                uStack_288 = uStack_1de8;
                auVar4 = vpcmpgtd_avx2(local_1a00,auVar39);
                local_1e20 = auVar4._0_8_;
                uStack_1e18 = auVar4._8_8_;
                uStack_1e10 = auVar4._16_8_;
                uStack_1e08 = auVar4._24_8_;
                local_980 = local_18e0;
                uStack_978 = uStack_18d8;
                uStack_970 = uStack_18d0;
                uStack_968 = uStack_18c8;
                local_9a0 = local_18c0;
                uStack_998 = uStack_18b8;
                uStack_990 = uStack_18b0;
                uStack_988 = uStack_18a8;
                local_9c0 = local_1e20;
                uStack_9b8 = uStack_1e18;
                uStack_9b0 = uStack_1e10;
                uStack_9a8 = uStack_1e08;
                auVar9._8_8_ = uStack_18d8;
                auVar9._0_8_ = local_18e0;
                auVar9._16_8_ = uStack_18d0;
                auVar9._24_8_ = uStack_18c8;
                auVar8._8_8_ = uStack_18b8;
                auVar8._0_8_ = local_18c0;
                auVar8._16_8_ = uStack_18b0;
                auVar8._24_8_ = uStack_18a8;
                vpblendvb_avx2(auVar9,auVar8,auVar4);
                vH_04[0]._4_4_ = in_stack_ffffffffffffe0fc;
                vH_04[0]._0_4_ = in_stack_ffffffffffffe0f8;
                vH_04[1] = in_stack_ffffffffffffe100;
                vH_04[2]._0_4_ = in_stack_ffffffffffffe108;
                vH_04[2]._4_4_ = in_stack_ffffffffffffe10c;
                vH_04[3] = in_stack_ffffffffffffe110;
                arr_store((__m256i *)CONCAT44(uVar42,uVar41),vH_04,
                          (int32_t)((ulong)in_stack_ffffffffffffe0f0 >> 0x20),
                          (int32_t)in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0ec);
              }
              local_2c0 = local_1a80._0_8_;
              uStack_2b8 = local_1a80._8_8_;
              uStack_2b0 = local_1a80._16_8_;
              uStack_2a8 = local_1a80._24_8_;
              local_2e0 = local_1a00._0_8_;
              uStack_2d8 = local_1a00._8_8_;
              uStack_2d0 = local_1a00._16_8_;
              uStack_2c8 = local_1a00._24_8_;
              local_6c0 = vpcmpgtd_avx2(local_1a80,local_1a00);
              local_1600 = local_1a80._0_8_;
              uStack_15f8 = local_1a80._8_8_;
              uStack_15f0 = local_1a80._16_8_;
              uStack_15e8 = local_1a80._24_8_;
              local_1620 = local_1a00._0_8_;
              uStack_1618 = local_1a00._8_8_;
              uStack_1610 = local_1a00._16_8_;
              uStack_1608 = local_1a00._24_8_;
              local_6e0 = vpcmpeqd_avx2(local_1a80,local_1a00);
              local_60 = vpor_avx2(local_6c0,local_6e0);
              if ((((((((((((((((((((((((((((((((local_60 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (local_60 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (local_60 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (local_60 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (local_60 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (local_60 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (local_60 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (local_60 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (local_60 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (local_60 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (local_60 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (local_60 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_60 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_60 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_60 >> 0x77 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_60 >> 0x7f,0) == '\0') &&
                                (local_60 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (local_60 >> 0x8f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_60 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_60 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (local_60 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && (local_60 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                          && (local_60 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_60 >> 0xbf,0) == '\0') &&
                        (local_60 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_60 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_60 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_60 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_60 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_60 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_60 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < local_60[0x1f]) goto LAB_00f5e0eb;
              local_580 = local_1aa0._0_8_;
              uStack_578 = local_1aa0._8_8_;
              uStack_570 = local_1aa0._16_8_;
              uStack_568 = local_1aa0._24_8_;
              uStack_590 = auStack_1730._0_8_;
              uStack_588 = auStack_1730._8_8_;
              auVar20._16_8_ = auStack_1730._0_8_;
              auVar20._0_16_ = local_1740;
              auVar20._24_8_ = auStack_1730._8_8_;
              local_1ac0 = vpsubd_avx2(local_1aa0,auVar20);
              local_d20 = local_1a00._0_8_;
              uStack_d18 = local_1a00._8_8_;
              uStack_d10 = local_1a00._16_8_;
              uStack_d08 = local_1a00._24_8_;
              local_d40 = local_1ac0._0_8_;
              uStack_d38 = local_1ac0._8_8_;
              uStack_d30 = local_1ac0._16_8_;
              uStack_d28 = local_1ac0._24_8_;
              auVar40 = ZEXT3264(local_1ac0);
              local_1aa0 = vpmaxsd_avx2(local_1a00,local_1ac0);
              local_e58 = local_16c8 + (int)local_1684;
              local_1cc0 = *local_e58;
              local_1a60 = local_1a80;
              local_5a0 = local_1740;
            }
          }
LAB_00f5e0eb:
          local_e60 = local_16c0 + local_16ac;
          auVar31 = *(undefined1 (*) [24])*local_e60;
          lStack_d48 = (*local_e60)[3];
          local_140 = local_1820._0_8_;
          uStack_138 = local_1820._8_8_;
          uStack_130 = local_1820._16_8_;
          uStack_128 = local_1820._24_8_;
          local_1ae0[0] = auVar31._0_8_;
          local_300 = local_1ae0[0];
          local_1ae0[1] = auVar31._8_8_;
          uStack_2f8 = local_1ae0[1];
          local_1ae0[2] = auVar31._16_8_;
          uStack_2f0 = local_1ae0[2];
          local_320 = local_1800._0_8_;
          uStack_318 = local_1800._8_8_;
          uStack_310 = local_1800._16_8_;
          uStack_308 = local_1800._24_8_;
          local_160 = vpcmpgtd_avx2((undefined1  [32])*local_e60,local_1800);
          auVar4 = vpand_avx2(local_1820,local_160);
          local_d60 = local_1ae0[0];
          uStack_d58 = local_1ae0[1];
          uStack_d50 = local_1ae0[2];
          local_d80 = local_1800._0_8_;
          uStack_d78 = local_1800._8_8_;
          uStack_d70 = local_1800._16_8_;
          uStack_d68 = local_1800._24_8_;
          auVar40 = ZEXT3264(local_1800);
          local_1800 = vpmaxsd_avx2((undefined1  [32])*local_e60,local_1800);
          local_1e60 = auVar4._0_8_;
          local_80 = local_1e60;
          uStack_1e58 = auVar4._8_8_;
          uStack_78 = uStack_1e58;
          uStack_1e50 = auVar4._16_8_;
          uStack_70 = uStack_1e50;
          lStack_1e48 = auVar4._24_8_;
          lStack_68 = lStack_1e48;
          if ((((((((((((((((((((((((((((((((auVar4 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar4 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar4 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar4 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar4 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar4 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar4 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar4 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar4 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar4 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar4 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar4 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar4 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar4 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar4 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             SUB321(auVar4 >> 0x7f,0) != '\0') ||
                            (auVar4 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar4 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar4 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar4 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar4 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar4 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar4 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar4 >> 0xbf,0) != '\0') ||
                    (auVar4 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar4 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar4 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar4 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar4 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar4 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar4 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_1e48 < 0)
          {
            local_1698 = local_1688;
          }
          lStack_2e8 = lStack_d48;
        }
        if (s2_beg != 0) {
          for (local_168c = 0; local_168c < (int)local_16b0; local_168c = local_168c + 1) {
            auVar4 = vperm2i128_avx2(auVar40._0_32_,local_1800,0x28);
            auVar40 = ZEXT3264(auVar4);
            local_1800 = vpalignr_avx2(local_1800,auVar4,0xc);
          }
          local_174c = local_1800._28_4_;
          local_1694 = local_1690 + -1;
        }
        if (in_stack_00000008 != 0) {
          local_1e68 = local_16c0;
          for (local_1684 = 0; (int)local_1684 < local_16a8 * local_16a4;
              local_1684 = local_1684 + 1) {
            iVar35 = (int)local_1684 / local_16a4 + ((int)local_1684 % local_16a4) * local_16a8;
            if (iVar35 < local_1690) {
              if ((int)local_174c < (int)(*local_1e68)[0]) {
                local_174c = (uint)(*local_1e68)[0];
                local_1698 = local_1674 + -1;
                local_1694 = iVar35;
              }
              else if ((((uint)(*local_1e68)[0] == local_174c) && (local_1698 == local_1674 + -1))
                      && (iVar35 < local_1694)) {
                local_1694 = iVar35;
              }
            }
            local_1e68 = (__m256i *)((long)*local_1e68 + 4);
          }
        }
        if ((in_stack_00000008 == 0) && (s2_beg == 0)) {
          local_e68 = local_16c0 + local_16ac;
          local_1ea0._0_32_ = *(undefined1 (*) [32])local_e68;
          for (local_168c = 0; local_168c < (int)local_16b0; local_168c = local_168c + 1) {
            auVar4 = vperm2i128_avx2(auVar40._0_32_,local_1ea0._0_32_,0x28);
            auVar40 = ZEXT3264(auVar4);
            local_1ea0._0_32_ = vpalignr_avx2(local_1ea0._0_32_,auVar4,0xc);
          }
          local_174c = local_1ea0._28_4_;
          local_1698 = local_1674 + -1;
          local_1694 = local_1690 + -1;
        }
        local_340 = local_1780;
        uStack_338 = uStack_1778;
        uStack_330 = uStack_1770;
        uStack_328 = uStack_1768;
        local_360 = local_17c0._0_8_;
        uStack_358 = local_17c0._8_8_;
        uStack_350 = local_17c0._16_8_;
        uStack_348 = local_17c0._24_8_;
        auVar27._8_8_ = uStack_1778;
        auVar27._0_8_ = local_1780;
        auVar27._16_8_ = uStack_1770;
        auVar27._24_8_ = uStack_1768;
        local_700 = vpcmpgtd_avx2(auVar27,local_17c0);
        local_380 = local_17e0._0_8_;
        uStack_378 = local_17e0._8_8_;
        uStack_370 = local_17e0._16_8_;
        uStack_368 = local_17e0._24_8_;
        local_3a0 = local_17a0;
        uStack_398 = uStack_1798;
        uStack_390 = uStack_1790;
        uStack_388 = uStack_1788;
        auVar26._8_8_ = uStack_1798;
        auVar26._0_8_ = local_17a0;
        auVar26._16_8_ = uStack_1790;
        auVar26._24_8_ = uStack_1788;
        local_720 = vpcmpgtd_avx2(local_17e0,auVar26);
        local_a0 = vpor_avx2(local_700,local_720);
        if ((((((((((((((((((((((((((((((((local_a0 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_a0 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_a0 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_a0 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_a0 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_a0 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_a0 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_a0 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_a0 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_a0 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_a0 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_a0 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_a0 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_a0 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_a0 >> 0x7f,0) != '\0') ||
                          (local_a0 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_a0 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_a0 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_a0 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_a0 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_a0 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_a0 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_a0 >> 0xbf,0) != '\0') ||
                  (local_a0 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_a0 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_a0 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_a0 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_a0 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_a0 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_a0 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_a0[0x1f] < '\0') {
          local_1828->flag = local_1828->flag | 0x40;
          local_174c = 0;
          local_1694 = 0;
          local_1698 = 0;
        }
        local_1828->score = local_174c;
        local_1828->end_query = local_1694;
        local_1828->end_ref = local_1698;
        parasail_free(local_16f0);
        parasail_free(local_16e8);
        parasail_free(local_16e0);
        parasail_free(local_16d8);
        parasail_free(local_16d0);
        parasail_free(local_16c8);
        parasail_free(local_16c0);
        local_1660 = local_1828;
      }
    }
  }
  return local_1660;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEaStore = NULL;
    __m256i* restrict pvEaLoad = NULL;
    __m256i* restrict pvHT = NULL;
    int32_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTDiag;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;
    __m256i vTMask;
    __m256i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi32(_mm256_set1_epi32(position),
            _mm256_set_epi32(0,1,2,3,4,5,6,7));
    vTIns  = _mm256_set1_epi32(PARASAIL_INS);
    vTDel  = _mm256_set1_epi32(PARASAIL_DEL);
    vTDiag = _mm256_set1_epi32(PARASAIL_DIAG);
    vTDiagE= _mm256_set1_epi32(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi32(PARASAIL_INS_E);
    vTDiagF= _mm256_set1_epi32(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi32(PARASAIL_DEL_F);
    vTMask = _mm256_set1_epi32(PARASAIL_ZERO_MASK);
    vFTMask= _mm256_set1_epi32(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 32, sizeof(__m256i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    pvEaStore= parasail_memalign___m256i(32, segLen);
    pvEaLoad = parasail_memalign___m256i(32, segLen);
    pvHT     = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int32_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_32_t h;
            __m256i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            _mm256_store_si256(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFa;
        __m256i vFa_ext;
        __m256i vH;
        __m256i vH_dag;
        const __m256i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi32_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi32(vH_dag, vE);
            vH = _mm256_max_epi32(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vF);

            {
                __m256i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m256i case1 = _mm256_cmpeq_epi32(vH, vH_dag);
                __m256i case2 = _mm256_cmpeq_epi32(vH, vF);
                __m256i vT = _mm256_blendv_epi8(
                        _mm256_blendv_epi8(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm256_store_si256(pvHT + i, vT);
                vT = _mm256_or_si256(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm256_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vEF_opn, vE_ext);
            _mm256_store_si256(pvE + i, vE);
            {
                __m256i vEa = _mm256_load_si256(pvEaLoad + i);
                __m256i vEa_ext = _mm256_sub_epi32(vEa, vGapE);
                vEa = _mm256_max_epi32(vEF_opn, vEa_ext);
                _mm256_store_si256(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vEa_ext);
                    __m256i vT = _mm256_blendv_epi8(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m256i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
                __m256i vT = _mm256_blendv_epi8(vTDelF, vTDiagF, cond);
                vT = _mm256_or_si256(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 4);
            vHp = _mm256_insert_epi32_rpl(vHp, boundary[j], 0);
            vEF_opn = _mm256_slli_si256_rpl(vEF_opn, 4);
            vEF_opn = _mm256_insert_epi32_rpl(vEF_opn, tmp2, 0);
            vF_ext = _mm256_slli_si256_rpl(vF_ext, 4);
            vF_ext = _mm256_insert_epi32_rpl(vF_ext, NEG_LIMIT, 0);
            vF = _mm256_slli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, tmp2, 0);
            vFa_ext = _mm256_slli_si256_rpl(vFa_ext, 4);
            vFa_ext = _mm256_insert_epi32_rpl(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm256_slli_si256_rpl(vFa, 4);
            vFa = _mm256_insert_epi32_rpl(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
                {
                    __m256i vTAll;
                    __m256i vT;
                    __m256i case1;
                    __m256i case2;
                    __m256i cond;
                    vHp = _mm256_add_epi32(vHp, _mm256_load_si256(vP + i));
                    case1 = _mm256_cmpeq_epi32(vH, vHp);
                    case2 = _mm256_cmpeq_epi32(vH, vF);
                    cond = _mm256_andnot_si256(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm256_load_si256(pvHT + i);
                    vT = _mm256_blendv_epi8(vT, vTDel, cond);
                    _mm256_store_si256(pvHT + i, vT);
                    vTAll = _mm256_and_si256(vTAll, vTMask);
                    vTAll = _mm256_or_si256(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m256i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vFa_ext);
                    __m256i vT = _mm256_blendv_epi8(vTDelF, vTDiagF, cond);
                    vTAll = _mm256_and_si256(vTAll, vFTMask);
                    vTAll = _mm256_or_si256(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm256_sub_epi32(vH, vGapO);
                vF_ext = _mm256_sub_epi32(vF, vGapE);
                {
                    __m256i vEa = _mm256_load_si256(pvEaLoad + i);
                    __m256i vEa_ext = _mm256_sub_epi32(vEa, vGapE);
                    vEa = _mm256_max_epi32(vEF_opn, vEa_ext);
                    _mm256_store_si256(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m256i cond = _mm256_cmpgt_epi32(vEF_opn, vEa_ext);
                        __m256i vT = _mm256_blendv_epi8(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm256_sub_epi32(vFa, vGapE);
                vFa = _mm256_max_epi32(vEF_opn, vFa_ext);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm256_max_epi32(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
        }
    }

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 4);
        }
        score = (int32_t) _mm256_extract_epi32_rpl(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            score = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}